

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::grow
          (MemoryBuffer<char,_500UL,_std::allocator<char>_> *this,size_t size)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  size_type __t;
  pointer ptr;
  char *__result;
  char *old_ptr;
  size_t old_capacity;
  char *new_ptr;
  size_t new_capacity;
  size_t size_local;
  MemoryBuffer<char,_500UL,_std::allocator<char>_> *this_local;
  
  new_ptr = (char *)(*(long *)&this->field_0x18 + (*(ulong *)&this->field_0x18 >> 1));
  if (new_ptr < size) {
    new_ptr = (char *)size;
  }
  ptr = std::allocator_traits<std::allocator<char>_>::allocate
                  (&this->super_allocator<char>,(size_type)new_ptr,(const_void_pointer)0x0);
  pcVar1 = *(char **)&this->field_0x8;
  lVar2 = *(long *)&this->field_0x8;
  lVar3 = *(long *)&this->field_0x10;
  __result = make_ptr<char>(ptr,(size_t)new_ptr);
  std::uninitialized_copy<char*,char*>(pcVar1,(char *)(lVar2 + lVar3),__result);
  __t = *(size_type *)&this->field_0x18;
  pcVar1 = *(char **)&this->field_0x8;
  *(char **)&this->field_0x18 = new_ptr;
  *(pointer *)&this->field_0x8 = ptr;
  if (pcVar1 != this->data_) {
    __gnu_cxx::new_allocator<char>::deallocate((new_allocator<char> *)this,pcVar1,__t);
  }
  return;
}

Assistant:

void MemoryBuffer<T, SIZE, Allocator>::grow(std::size_t size) {
  std::size_t new_capacity = this->capacity_ + this->capacity_ / 2;
  if (size > new_capacity)
      new_capacity = size;
#if FMT_USE_ALLOCATOR_TRAITS
  T *new_ptr =
      std::allocator_traits<Allocator>::allocate(*this, new_capacity, FMT_NULL);
#else
  T *new_ptr = this->allocate(new_capacity, FMT_NULL);
#endif
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(this->ptr_, this->ptr_ + this->size_,
                          make_ptr(new_ptr, new_capacity));
  std::size_t old_capacity = this->capacity_;
  T *old_ptr = this->ptr_;
  this->capacity_ = new_capacity;
  this->ptr_ = new_ptr;
  // deallocate may throw (at least in principle), but it doesn't matter since
  // the buffer already uses the new storage and will deallocate it in case
  // of exception.
  if (old_ptr != data_)
    Allocator::deallocate(old_ptr, old_capacity);
}